

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

void google::protobuf::internal::PrintAllCounters(void)

{
  Nonnull<std::FILE_*> output;
  Map *pMVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  variant_alternative_t<1UL,_variant<long,_basic_string_view<char,_char_traits<char>_>_>_> *args;
  variant_alternative_t<0UL,_variant<long,_basic_string_view<char,_char_traits<char>_>_>_> *args_00;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  unsigned_long uVar6;
  iterator __begin3;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t value;
  size_t total;
  FormatSpec<> local_60;
  unsigned_long local_50;
  unsigned_long local_48;
  _Rb_tree_node_base *local_40;
  double local_38;
  
  pMVar1 = CounterMap();
  if ((pMVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_60.super_type.spec_.data_ = "Protobuf debug counters:\n";
    local_60.super_type.spec_.size_ = 0x19;
    absl::lts_20250127::FPrintF<>(_stderr,&local_60);
    local_40 = &(pMVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
    for (p_Var5 = (pMVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; p_Var5 != local_40
        ; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      local_60.super_type.spec_.data_ = "  %-12s:\n";
      local_60.super_type.spec_.size_ = 9;
      absl::lts_20250127::FPrintF<std::basic_string_view<char,_std::char_traits<char>_>_>
                (_stderr,(FormatSpec<std::basic_string_view<char>_> *)&local_60,
                 (basic_string_view<char,_std::char_traits<char>_> *)(p_Var5 + 1));
      local_48 = 0;
      uVar6 = 0;
      p_Var4 = p_Var5[2]._M_parent;
      for (p_Var2 = p_Var4; p_Var2 != (_Rb_tree_node_base *)&p_Var5[1]._M_right;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        for (p_Var3 = p_Var2[1]._M_right; p_Var3 != *(_Base_ptr *)(p_Var2 + 2);
            p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
          uVar6 = uVar6 + **(long **)p_Var3;
          local_48 = uVar6;
        }
      }
      for (; output = _stderr, p_Var4 != (_Rb_tree_node_base *)&p_Var5[1]._M_right;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        local_50 = 0;
        for (p_Var3 = p_Var4[1]._M_right; p_Var3 != *(_Base_ptr *)(p_Var4 + 2);
            p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
          local_50 = local_50 + **(long **)p_Var3;
        }
        if (*(char *)&p_Var4[1]._M_left == '\0') {
          local_60.super_type.spec_.data_ = "    %9d : %10zu";
          local_60.super_type.spec_.size_ = 0xf;
          args_00 = std::get<0ul,long,std::basic_string_view<char,std::char_traits<char>>>
                              ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                *)(p_Var4 + 1));
          absl::lts_20250127::FPrintF<long,_unsigned_long>
                    (output,(FormatSpec<long,_unsigned_long> *)&local_60,args_00,&local_50);
        }
        else {
          local_60.super_type.spec_.data_ = "    %-10s: %10zu";
          local_60.super_type.spec_.size_ = 0x10;
          args = std::get<1ul,long,std::basic_string_view<char,std::char_traits<char>>>
                           ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_> *
                            )(p_Var4 + 1));
          absl::lts_20250127::
          FPrintF<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    (output,(FormatSpec<std::basic_string_view<char>,_unsigned_long> *)&local_60,
                     args,&local_50);
        }
        if ((local_48 != 0) && ((_Base_ptr)0x1 < p_Var5[2]._M_right)) {
          local_60.super_type.spec_.data_ = " (%5.2f%%)";
          local_60.super_type.spec_.size_ = 10;
          auVar7._8_4_ = (int)(local_50 >> 0x20);
          auVar7._0_8_ = local_50;
          auVar7._12_4_ = 0x45300000;
          auVar8._8_4_ = (int)(local_48 >> 0x20);
          auVar8._0_8_ = local_48;
          auVar8._12_4_ = 0x45300000;
          local_38 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) * 100.0) /
                     ((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0));
          absl::lts_20250127::FPrintF<double>(_stderr,(FormatSpec<double> *)&local_60,&local_38);
        }
        local_60.super_type.spec_.data_ = "\n";
        local_60.super_type.spec_.size_ = 1;
        absl::lts_20250127::FPrintF<>(_stderr,&local_60);
      }
      if ((local_48 != 0) && ((_Base_ptr)0x1 < p_Var5[2]._M_right)) {
        local_60.super_type.spec_.data_ = "    %-10s: %10zu\n";
        local_60.super_type.spec_.size_ = 0x11;
        absl::lts_20250127::FPrintF<char[6],_unsigned_long>
                  (_stderr,(FormatSpec<char[6],_unsigned_long> *)&local_60,(char (*) [6])"Total",
                   &local_48);
      }
    }
  }
  return;
}

Assistant:

static void PrintAllCounters() {
  auto& counters = CounterMap();
  if (counters.empty()) return;
  absl::FPrintF(stderr, "Protobuf debug counters:\n");
  for (auto& [category_name, category_map] : counters) {
    // Example output:
    //
    //   Category  :
    //     Value 1 : 1234 (12.34%)
    //     Value 2 : 2345 (23.45%)
    //     Total   : 3579
    absl::FPrintF(stderr, "  %-12s:\n", category_name);
    size_t total = 0;
    for (auto& entry : category_map) {
      for (auto* counter : entry.second) {
        total += counter->value();
      }
    }
    for (auto& [subname, counter_vector] : category_map) {
      size_t value = 0;
      for (auto* counter : counter_vector) {
        value += counter->value();
      }
      if (std::holds_alternative<int64_t>(subname)) {
        // For integers, right align
        absl::FPrintF(stderr, "    %9d : %10zu", std::get<int64_t>(subname),
                      value);
      } else {
        // For strings, left align
        absl::FPrintF(stderr, "    %-10s: %10zu",
                      std::get<absl::string_view>(subname), value);
      }
      if (total != 0 && category_map.size() > 1) {
        absl::FPrintF(
            stderr, " (%5.2f%%)",
            100. * static_cast<double>(value) / static_cast<double>(total));
      }
      absl::FPrintF(stderr, "\n");
    }
    if (total != 0 && category_map.size() > 1) {
      absl::FPrintF(stderr, "    %-10s: %10zu\n", "Total", total);
    }
  }
}